

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

char * nlohmann::json_abi_v3_11_2::detail::dtoa_impl::format_buffer
                 (char *buf,int len,int decimal_exponent,int min_exp,int max_exp)

{
  uint uVar1;
  char *pcVar2;
  uint uVar3;
  ulong uVar4;
  byte bVar5;
  uint uVar6;
  char *pcVar7;
  
  if (-1 < min_exp) {
    __assert_fail("min_exp < 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/3rdparty/json.hpp"
                  ,0x4566,
                  "char *nlohmann::detail::dtoa_impl::format_buffer(char *, int, int, int, int)");
  }
  if (0 < max_exp) {
    uVar6 = decimal_exponent + len;
    if (max_exp < (int)uVar6 || decimal_exponent < 0) {
      if ((int)uVar6 < 1 || max_exp < (int)uVar6) {
        if ((int)uVar6 < 1 && min_exp < (int)uVar6) {
          memmove(buf + (ulong)-uVar6 + 2,buf,(long)len);
          buf[0] = '0';
          buf[1] = '.';
          memset(buf + 2,0x30,(ulong)-uVar6);
          pcVar7 = buf + (ulong)-uVar6 + 2 + len;
        }
        else {
          if (len != 1) {
            memmove(buf + 2,buf + 1,(long)len - 1);
            buf[1] = '.';
            buf = buf + len;
          }
          buf[1] = 'e';
          if ((int)uVar6 < -0x3e6) {
            __assert_fail("e > -1000",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/3rdparty/json.hpp"
                          ,0x4531,"char *nlohmann::detail::dtoa_impl::append_exponent(char *, int)")
            ;
          }
          if (1000 < (int)uVar6) {
            __assert_fail("e < 1000",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/3rdparty/json.hpp"
                          ,0x4532,"char *nlohmann::detail::dtoa_impl::append_exponent(char *, int)")
            ;
          }
          uVar1 = uVar6 - 1;
          uVar3 = -uVar1;
          if (0 < (int)uVar1) {
            uVar3 = uVar1;
          }
          buf[2] = ((int)uVar6 < 1) * '\x02' + '+';
          if (uVar3 < 10) {
            buf[3] = '0';
          }
          else {
            if (99 < uVar3) {
              buf[3] = (char)(uVar3 / 100) + '0';
              bVar5 = (byte)((ulong)(uVar3 % 100) * 0x1999999a >> 0x20);
              buf[4] = bVar5 | 0x30;
              buf[5] = (char)(uVar3 % 100) + bVar5 * -10 | 0x30;
              return buf + 6;
            }
            buf[3] = (byte)((ulong)uVar3 / 10) | 0x30;
            uVar3 = uVar3 + (uVar3 / 10 + uVar3 / 10) * -5;
          }
          buf[4] = (byte)uVar3 | 0x30;
          pcVar7 = buf + 5;
        }
      }
      else {
        if (-1 < decimal_exponent) {
          __assert_fail("k > n",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/3rdparty/json.hpp"
                        ,0x4581,
                        "char *nlohmann::detail::dtoa_impl::format_buffer(char *, int, int, int, int)"
                       );
        }
        uVar4 = (ulong)uVar6;
        memmove(buf + uVar4 + 1,buf + uVar4,(uint)len - uVar4);
        buf[uVar4] = '.';
        pcVar7 = buf + (ulong)(uint)len + 1;
      }
    }
    else {
      memset(buf + len,0x30,(long)(int)uVar6 - (long)len);
      pcVar2 = buf + (int)uVar6;
      pcVar7 = pcVar2 + 2;
      pcVar2[0] = '.';
      pcVar2[1] = '0';
    }
    return pcVar7;
  }
  __assert_fail("max_exp > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/nickware44[P]interference/3rdparty/json.hpp"
                ,0x4567,
                "char *nlohmann::detail::dtoa_impl::format_buffer(char *, int, int, int, int)");
}

Assistant:

inline char* format_buffer(char* buf, int len, int decimal_exponent,
                           int min_exp, int max_exp)
{
    JSON_ASSERT(min_exp < 0);
    JSON_ASSERT(max_exp > 0);

    const int k = len;
    const int n = len + decimal_exponent;

    // v = buf * 10^(n-k)
    // k is the length of the buffer (number of decimal digits)
    // n is the position of the decimal point relative to the start of the buffer.

    if (k <= n && n <= max_exp)
    {
        // digits[000]
        // len <= max_exp + 2

        std::memset(buf + k, '0', static_cast<size_t>(n) - static_cast<size_t>(k));
        // Make it look like a floating-point number (#362, #378)
        buf[n + 0] = '.';
        buf[n + 1] = '0';
        return buf + (static_cast<size_t>(n) + 2);
    }

    if (0 < n && n <= max_exp)
    {
        // dig.its
        // len <= max_digits10 + 1

        JSON_ASSERT(k > n);

        std::memmove(buf + (static_cast<size_t>(n) + 1), buf + n, static_cast<size_t>(k) - static_cast<size_t>(n));
        buf[n] = '.';
        return buf + (static_cast<size_t>(k) + 1U);
    }

    if (min_exp < n && n <= 0)
    {
        // 0.[000]digits
        // len <= 2 + (-min_exp - 1) + max_digits10

        std::memmove(buf + (2 + static_cast<size_t>(-n)), buf, static_cast<size_t>(k));
        buf[0] = '0';
        buf[1] = '.';
        std::memset(buf + 2, '0', static_cast<size_t>(-n));
        return buf + (2U + static_cast<size_t>(-n) + static_cast<size_t>(k));
    }

    if (k == 1)
    {
        // dE+123
        // len <= 1 + 5

        buf += 1;
    }
    else
    {
        // d.igitsE+123
        // len <= max_digits10 + 1 + 5

        std::memmove(buf + 2, buf + 1, static_cast<size_t>(k) - 1);
        buf[1] = '.';
        buf += 1 + static_cast<size_t>(k);
    }

    *buf++ = 'e';
    return append_exponent(buf, n - 1);
}